

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::GetAutoUicOptions
          (cmGeneratorTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *result,string *config)

{
  cmLocalGenerator *lg;
  Snapshot snapshot;
  char *pcVar1;
  string *target;
  cmCompiledGeneratorExpression *this_00;
  allocator local_259;
  string local_258;
  undefined1 local_238 [8];
  string local_230;
  allocator local_209;
  string local_208;
  undefined1 local_1e8 [8];
  cmGeneratorExpressionDAGChecker dagChecker;
  Snapshot local_f8;
  cmListFileBacktrace local_e0;
  undefined1 local_a0 [8];
  cmGeneratorExpression ge;
  allocator local_49;
  string local_48;
  char *local_28;
  char *prop;
  string *config_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result_local;
  cmGeneratorTarget *this_local;
  
  prop = (char *)config;
  config_local = (string *)result;
  result_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"AUTOUIC_OPTIONS",&local_49);
  pcVar1 = GetLinkInterfaceDependentStringProperty(this,&local_48,(string *)prop);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (pcVar1 != (char *)0x0) {
    local_28 = pcVar1;
    cmState::Snapshot::Snapshot(&local_f8,(cmState *)0x0);
    cmCommandContext::cmCommandContext((cmCommandContext *)&dagChecker.CheckResult);
    snapshot.Position.Tree = local_f8.Position.Tree;
    snapshot.State = local_f8.State;
    snapshot.Position.Position = local_f8.Position.Position;
    cmListFileBacktrace::cmListFileBacktrace
              (&local_e0,snapshot,(cmCommandContext *)&dagChecker.CheckResult);
    cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_a0,&local_e0);
    cmListFileBacktrace::~cmListFileBacktrace(&local_e0);
    cmCommandContext::~cmCommandContext((cmCommandContext *)&dagChecker.CheckResult);
    target = GetName_abi_cxx11_(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_208,"AUTOUIC_OPTIONS",(allocator *)(local_238 + 0x2f));
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)local_1e8,target,&local_208,
               (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator((allocator<char> *)(local_238 + 0x2f));
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_238,local_a0);
    this_00 = cmsys::auto_ptr<cmCompiledGeneratorExpression>::operator->
                        ((auto_ptr<cmCompiledGeneratorExpression> *)local_238);
    pcVar1 = prop;
    lg = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_258);
    pcVar1 = cmCompiledGeneratorExpression::Evaluate
                       (this_00,lg,(string *)pcVar1,false,this,
                        (cmGeneratorExpressionDAGChecker *)local_1e8,&local_258);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_238 + 8),pcVar1,&local_259);
    cmSystemTools::ExpandListArgument
              ((string *)(local_238 + 8),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)config_local,false);
    std::__cxx11::string::~string((string *)(local_238 + 8));
    std::allocator<char>::~allocator((allocator<char> *)&local_259);
    std::__cxx11::string::~string((string *)&local_258);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_238);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)local_1e8);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_a0);
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetAutoUicOptions(std::vector<std::string> &result,
                                 const std::string& config) const
{
  const char *prop
            = this->GetLinkInterfaceDependentStringProperty("AUTOUIC_OPTIONS",
                                                            config);
  if (!prop)
    {
    return;
    }
  cmGeneratorExpression ge;

  cmGeneratorExpressionDAGChecker dagChecker(
                                      this->GetName(),
                                      "AUTOUIC_OPTIONS", 0, 0);
  cmSystemTools::ExpandListArgument(ge.Parse(prop)
                                      ->Evaluate(this->LocalGenerator,
                                                config,
                                                false,
                                                this,
                                                &dagChecker),
                                  result);
}